

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCnf.c
# Opt level: O3

void Fra_CnfNodeAddToSolver(Fra_Man_t *p,Aig_Obj_t *pOld,Aig_Obj_t *pNew)

{
  Aig_Obj_t *pNode;
  int iVar1;
  Vec_Ptr_t *vFrontier;
  void **ppvVar2;
  Vec_Ptr_t *vSuper;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  if (pOld == (Aig_Obj_t *)0x0 && pNew == (Aig_Obj_t *)0x0) {
    __assert_fail("pOld || pNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                  ,0xf3,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((pOld == (Aig_Obj_t *)0x0) ||
      (*(long *)(*(long *)((long)(pOld->field_5).pData + 0x90) + (long)pOld->Id * 8) != 0)) &&
     ((pNew == (Aig_Obj_t *)0x0 ||
      (*(long *)(*(long *)((long)(pNew->field_5).pData + 0x90) + (long)pNew->Id * 8) != 0)))) {
    return;
  }
  vFrontier = (Vec_Ptr_t *)malloc(0x10);
  vFrontier->nCap = 100;
  vFrontier->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  vFrontier->pArray = ppvVar2;
  if (pOld != (Aig_Obj_t *)0x0) {
    Fra_ObjAddToFrontier(p,pOld,vFrontier);
  }
  if (pNew != (Aig_Obj_t *)0x0) {
    Fra_ObjAddToFrontier(p,pNew,vFrontier);
  }
  if (0 < vFrontier->nSize) {
    lVar9 = 0;
    do {
      pNode = (Aig_Obj_t *)vFrontier->pArray[lVar9];
      if (*(int *)(*(long *)((long)(pNode->field_5).pData + 0x98) + (long)pNode->Id * 4) == 0) {
        __assert_fail("Fra_ObjSatNum(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                      ,0xff,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      if (*(long *)(*(long *)((long)(pNode->field_5).pData + 0x90) + (long)pNode->Id * 8) != 0) {
        __assert_fail("Fra_ObjFaninVec(pNode) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                      ,0x100,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      iVar1 = Aig_ObjIsMuxType(pNode);
      if (iVar1 == 0) {
        vSuper = Fra_CollectSuper(pNode,1);
        if (0 < vSuper->nSize) {
          lVar6 = 0;
          do {
            Fra_ObjAddToFrontier
                      (p,(Aig_Obj_t *)((ulong)vSuper->pArray[lVar6] & 0xfffffffffffffffe),vFrontier)
            ;
            lVar6 = lVar6 + 1;
          } while (lVar6 < vSuper->nSize);
        }
        Fra_AddClausesSuper(p,pNode,vSuper);
      }
      else {
        vSuper = (Vec_Ptr_t *)malloc(0x10);
        vSuper->nCap = 8;
        ppvVar2 = (void **)malloc(0x40);
        vSuper->pArray = ppvVar2;
        pvVar5 = (void *)(*(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 8) &
                         0xfffffffffffffffe);
        vSuper->nSize = 1;
        *ppvVar2 = pvVar5;
        pvVar4 = (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 8) &
                         0xfffffffffffffffe);
        if (pvVar5 == pvVar4) {
          uVar3 = 1;
        }
        else {
          vSuper->nSize = 2;
          ppvVar2[1] = pvVar4;
          uVar3 = 2;
        }
        pvVar4 = (void *)(*(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x10) &
                         0xfffffffffffffffe);
        uVar7 = (ulong)uVar3;
        uVar8 = 0;
        do {
          if (ppvVar2[uVar8] == pvVar4) goto LAB_005d0ea6;
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
        uVar3 = uVar3 + 1;
        vSuper->nSize = uVar3;
        ppvVar2[uVar7] = pvVar4;
LAB_005d0ea6:
        pvVar4 = (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 0x10) &
                         0xfffffffffffffffe);
        uVar7 = 0;
        do {
          if (ppvVar2[uVar7] == pvVar4) goto LAB_005d0ed4;
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
        vSuper->nSize = uVar3 + 1;
        ppvVar2[uVar3] = pvVar4;
LAB_005d0ed4:
        lVar6 = 0;
        do {
          Fra_ObjAddToFrontier
                    (p,(Aig_Obj_t *)((ulong)vSuper->pArray[lVar6] & 0xfffffffffffffffe),vFrontier);
          lVar6 = lVar6 + 1;
        } while (lVar6 < vSuper->nSize);
        Fra_AddClausesMux(p,pNode);
      }
      if (vSuper->nSize < 2) {
        __assert_fail("Vec_PtrSize(vFanins) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraCnf.c"
                      ,0x113,"void Fra_CnfNodeAddToSolver(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      *(Vec_Ptr_t **)(*(long *)((long)(pNode->field_5).pData + 0x90) + (long)pNode->Id * 8) = vSuper
      ;
      lVar9 = lVar9 + 1;
    } while (lVar9 < vFrontier->nSize);
  }
  if (vFrontier->pArray != (void **)0x0) {
    free(vFrontier->pArray);
  }
  free(vFrontier);
  return;
}

Assistant:

void Fra_CnfNodeAddToSolver( Fra_Man_t * p, Aig_Obj_t * pOld, Aig_Obj_t * pNew )
{ 
    Vec_Ptr_t * vFrontier, * vFanins;
    Aig_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    assert( pOld || pNew );
    // quit if CNF is ready
    if ( (!pOld || Fra_ObjFaninVec(pOld)) && (!pNew || Fra_ObjFaninVec(pNew)) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    if ( pOld ) Fra_ObjAddToFrontier( p, pOld, vFrontier );
    if ( pNew ) Fra_ObjAddToFrontier( p, pNew, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Aig_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Fra_ObjSatNum(pNode) );
        assert( Fra_ObjFaninVec(pNode) == NULL );
        if ( fUseMuxes && Aig_ObjIsMuxType(pNode) )
        {
            vFanins = Vec_PtrAlloc( 4 );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin0( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin0( Aig_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin1( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Aig_ObjFanin1( Aig_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Aig_Obj_t *, vFanins, pFanin, k )
                Fra_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Fra_AddClausesMux( p, pNode );
        }
        else
        {
            vFanins = Fra_CollectSuper( pNode, fUseMuxes );
            Vec_PtrForEachEntry( Aig_Obj_t *, vFanins, pFanin, k )
                Fra_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Fra_AddClausesSuper( p, pNode, vFanins );
        }
        assert( Vec_PtrSize(vFanins) > 1 );
        Fra_ObjSetFaninVec( pNode, vFanins );
    }
    Vec_PtrFree( vFrontier );
}